

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O1

void __thiscall merlin::detail::edge::messageBwd(edge *this)

{
  edge *peVar1;
  pointer ppeVar2;
  long lVar3;
  node *pnVar4;
  ulong uVar5;
  variable_set elim;
  factor F;
  variable_set local_110;
  factor local_d8;
  factor local_78;
  
  factor::factor(&local_d8,&this->second->theta);
  pnVar4 = this->second;
  ppeVar2 = (pnVar4->edges).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((pnVar4->edges).
      super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar2) {
    uVar5 = 0;
    do {
      peVar1 = ppeVar2[uVar5];
      if (peVar1 != this) {
        lVar3 = 0xa8;
        if ((peVar1->first->id == pnVar4->id) || (lVar3 = 0x48, peVar1->second->id == pnVar4->id)) {
          factor::binaryOpIP<merlin::factor::binOpTimes>
                    (&local_d8,
                     (long)&(peVar1->sepset).m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar3);
        }
      }
      uVar5 = uVar5 + 1;
      pnVar4 = this->second;
      ppeVar2 = (pnVar4->edges).
                super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(pnVar4->edges).
                                   super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3))
    ;
  }
  variable_set::operator-(&local_110,&pnVar4->clique,&this->sepset);
  if (local_110.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_110.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    factor::sum(&local_78,&local_d8,&local_110);
    factor::operator=(&local_d8,&local_78);
    factor::~factor(&local_78);
  }
  factor::operator=(&this->bwd,&local_d8);
  variable_set::~variable_set(&local_110);
  factor::~factor(&local_d8);
  return;
}

Assistant:

void detail::edge::messageBwd() {

	// collect the original functions
	factor F = second->theta;

	// collect the incoming messages
	for (size_t i = 0; i < second->edges.size(); ++i) {
		detail::edge* e = second->edges[i];
		if (e == this) {
			continue; // skip current edge
		}
		if (e->first->id == second->id) {
			F *= e->bwd; //e->getMessage2();
		} else if (e->second->id == second->id) {
			F *= e->fwd; //e->getMessage1();
		}
	}

	// marginalize the eliminator
	variable_set elim = (second->clique - sepset);
	if (elim.size() > 0) {
		F = F.sum(elim);
	}

	this->bwd = F;
}